

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O1

void ym2413_update_one(void *_chip,UINT32 length,DEV_SMPL **buffers)

{
  int *piVar1;
  byte bVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  
  if (length != 0) {
    pDVar3 = *buffers;
    pDVar4 = buffers[1];
    bVar2 = *(byte *)((long)_chip + 0x6a0);
    uVar16 = 0;
    do {
      *(undefined8 *)((long)_chip + 0x1780) = 0;
      uVar6 = *(int *)((long)_chip + 0x6ac) + *(int *)((long)_chip + 0x6b0);
      uVar12 = *(int *)((long)_chip + 0x6ac) + 0x2e000000 + *(int *)((long)_chip + 0x6b0);
      if (uVar6 < 0xd2000000) {
        uVar12 = uVar6;
      }
      *(uint *)((long)_chip + 0x6ac) = uVar12;
      uVar12 = (uint)(""[uVar12 >> 0x18] >> 1);
      *(uint *)((long)_chip + 0x6a4) = uVar12;
      uVar6 = *(int *)((long)_chip + 0x6b4) + *(int *)((long)_chip + 0x6b8);
      *(uint *)((long)_chip + 0x6b4) = uVar6;
      *(uint *)((long)_chip + 0x6a8) = uVar6 >> 0x18 & 7;
      if (*(char *)((long)_chip + 0xbe) == '\0') {
        uVar6 = (*(uint *)((long)_chip + 0x50) & uVar12) +
                *(int *)((long)_chip + 0x38) + *(int *)((long)_chip + 0x34);
        iVar13 = *(int *)((long)_chip + 0x24);
        iVar7 = *(int *)((long)_chip + 0x28);
        *(int *)((long)_chip + 0x24) = iVar7;
        *(undefined4 *)((long)_chip + 0x28) = 0;
        if (uVar6 < 0xb0) {
          iVar13 = iVar13 + iVar7;
          iVar10 = 0;
          if (*(byte *)((long)_chip + 0x20) == 0) {
            iVar13 = 0;
          }
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((*(uint *)((long)_chip + 0x18) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)_chip + 0x20) & 0x1f)) >> 0x10 & 0x3ff) +
                          *(int *)((long)_chip + 0x58)];
          if (uVar6 < 0x1600) {
            iVar10 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0x28) = iVar10;
        }
        uVar6 = (*(uint *)((long)_chip + 0xa4) & uVar12) +
                *(int *)((long)_chip + 0x8c) + *(int *)((long)_chip + 0x88);
        if (uVar6 < 0xb0) {
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((uint)(iVar7 * 0x20000 + *(int *)((long)_chip + 0x6c)) >> 0x10 & 0x3ff) +
                          *(int *)((long)_chip + 0xac)];
          iVar13 = 0;
          if (uVar6 < 0x1600) {
            iVar13 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0x1780) = iVar13;
        }
      }
      if (*(char *)((long)_chip + 0x176) == '\0') {
        uVar6 = (*(uint *)((long)_chip + 0x108) & uVar12) +
                *(int *)((long)_chip + 0xf0) + *(int *)((long)_chip + 0xec);
        iVar13 = *(int *)((long)_chip + 0xdc);
        iVar7 = *(int *)((long)_chip + 0xe0);
        *(int *)((long)_chip + 0xdc) = iVar7;
        *(undefined4 *)((long)_chip + 0xe0) = 0;
        if (uVar6 < 0xb0) {
          iVar13 = iVar13 + iVar7;
          iVar10 = 0;
          if (*(byte *)((long)_chip + 0xd8) == 0) {
            iVar13 = 0;
          }
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((*(uint *)((long)_chip + 0xd0) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)_chip + 0xd8) & 0x1f)) >> 0x10 & 0x3ff) +
                          *(int *)((long)_chip + 0x110)];
          if (uVar6 < 0x1600) {
            iVar10 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0xe0) = iVar10;
        }
        uVar6 = (*(uint *)((long)_chip + 0x15c) & uVar12) +
                *(int *)((long)_chip + 0x144) + *(int *)((long)_chip + 0x140);
        if (uVar6 < 0xb0) {
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((uint)(iVar7 * 0x20000 + *(int *)((long)_chip + 0x124)) >> 0x10 & 0x3ff)
                          + *(int *)((long)_chip + 0x164)];
          iVar13 = 0;
          if (uVar6 < 0x1600) {
            iVar13 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0x1780) = *(int *)((long)_chip + 0x1780) + iVar13;
        }
      }
      if (*(char *)((long)_chip + 0x22e) == '\0') {
        uVar6 = (*(uint *)((long)_chip + 0x1c0) & uVar12) +
                *(int *)((long)_chip + 0x1a8) + *(int *)((long)_chip + 0x1a4);
        iVar13 = *(int *)((long)_chip + 0x194);
        iVar7 = *(int *)((long)_chip + 0x198);
        *(int *)((long)_chip + 0x194) = iVar7;
        *(undefined4 *)((long)_chip + 0x198) = 0;
        if (uVar6 < 0xb0) {
          iVar13 = iVar13 + iVar7;
          iVar10 = 0;
          if (*(byte *)((long)_chip + 400) == 0) {
            iVar13 = 0;
          }
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((*(uint *)((long)_chip + 0x188) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)_chip + 400) & 0x1f)) >> 0x10 & 0x3ff) +
                          *(int *)((long)_chip + 0x1c8)];
          if (uVar6 < 0x1600) {
            iVar10 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0x198) = iVar10;
        }
        uVar6 = (*(uint *)((long)_chip + 0x214) & uVar12) +
                *(int *)((long)_chip + 0x1fc) + *(int *)((long)_chip + 0x1f8);
        if (uVar6 < 0xb0) {
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((uint)(iVar7 * 0x20000 + *(int *)((long)_chip + 0x1dc)) >> 0x10 & 0x3ff)
                          + *(int *)((long)_chip + 0x21c)];
          iVar13 = 0;
          if (uVar6 < 0x1600) {
            iVar13 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0x1780) = *(int *)((long)_chip + 0x1780) + iVar13;
        }
      }
      if (*(char *)((long)_chip + 0x2e6) == '\0') {
        uVar6 = (*(uint *)((long)_chip + 0x278) & uVar12) +
                *(int *)((long)_chip + 0x260) + *(int *)((long)_chip + 0x25c);
        iVar13 = *(int *)((long)_chip + 0x24c);
        iVar7 = *(int *)((long)_chip + 0x250);
        *(int *)((long)_chip + 0x24c) = iVar7;
        *(undefined4 *)((long)_chip + 0x250) = 0;
        if (uVar6 < 0xb0) {
          iVar13 = iVar13 + iVar7;
          iVar10 = 0;
          if (*(byte *)((long)_chip + 0x248) == 0) {
            iVar13 = 0;
          }
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((*(uint *)((long)_chip + 0x240) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)_chip + 0x248) & 0x1f)) >> 0x10 & 0x3ff) +
                          *(int *)((long)_chip + 0x280)];
          if (uVar6 < 0x1600) {
            iVar10 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0x250) = iVar10;
        }
        uVar6 = (*(uint *)((long)_chip + 0x2cc) & uVar12) +
                *(int *)((long)_chip + 0x2b4) + *(int *)((long)_chip + 0x2b0);
        if (uVar6 < 0xb0) {
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((uint)(iVar7 * 0x20000 + *(int *)((long)_chip + 0x294)) >> 0x10 & 0x3ff)
                          + *(int *)((long)_chip + 0x2d4)];
          iVar13 = 0;
          if (uVar6 < 0x1600) {
            iVar13 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0x1780) = *(int *)((long)_chip + 0x1780) + iVar13;
        }
      }
      if (*(char *)((long)_chip + 0x39e) == '\0') {
        uVar6 = (*(uint *)((long)_chip + 0x330) & uVar12) +
                *(int *)((long)_chip + 0x318) + *(int *)((long)_chip + 0x314);
        iVar13 = *(int *)((long)_chip + 0x304);
        iVar7 = *(int *)((long)_chip + 0x308);
        *(int *)((long)_chip + 0x304) = iVar7;
        *(undefined4 *)((long)_chip + 0x308) = 0;
        if (uVar6 < 0xb0) {
          iVar13 = iVar13 + iVar7;
          iVar10 = 0;
          if (*(byte *)((long)_chip + 0x300) == 0) {
            iVar13 = 0;
          }
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((*(uint *)((long)_chip + 0x2f8) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)_chip + 0x300) & 0x1f)) >> 0x10 & 0x3ff) +
                          *(int *)((long)_chip + 0x338)];
          if (uVar6 < 0x1600) {
            iVar10 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0x308) = iVar10;
        }
        uVar6 = (*(uint *)((long)_chip + 900) & uVar12) +
                *(int *)((long)_chip + 0x36c) + *(int *)((long)_chip + 0x368);
        if (uVar6 < 0xb0) {
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((uint)(iVar7 * 0x20000 + *(int *)((long)_chip + 0x34c)) >> 0x10 & 0x3ff)
                          + *(int *)((long)_chip + 0x38c)];
          iVar13 = 0;
          if (uVar6 < 0x1600) {
            iVar13 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0x1780) = *(int *)((long)_chip + 0x1780) + iVar13;
        }
      }
      if (*(char *)((long)_chip + 0x456) == '\0') {
        uVar6 = (*(uint *)((long)_chip + 1000) & uVar12) +
                *(int *)((long)_chip + 0x3d0) + *(int *)((long)_chip + 0x3cc);
        iVar13 = *(int *)((long)_chip + 0x3bc);
        iVar7 = *(int *)((long)_chip + 0x3c0);
        *(int *)((long)_chip + 0x3bc) = iVar7;
        *(undefined4 *)((long)_chip + 0x3c0) = 0;
        if (uVar6 < 0xb0) {
          iVar13 = iVar13 + iVar7;
          iVar10 = 0;
          if (*(byte *)((long)_chip + 0x3b8) == 0) {
            iVar13 = 0;
          }
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((*(uint *)((long)_chip + 0x3b0) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)_chip + 0x3b8) & 0x1f)) >> 0x10 & 0x3ff) +
                          *(int *)((long)_chip + 0x3f0)];
          if (uVar6 < 0x1600) {
            iVar10 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0x3c0) = iVar10;
        }
        uVar6 = (*(uint *)((long)_chip + 0x43c) & uVar12) +
                *(int *)((long)_chip + 0x424) + *(int *)((long)_chip + 0x420);
        if (uVar6 < 0xb0) {
          uVar6 = uVar6 * 0x20 +
                  sin_tab[((uint)(iVar7 * 0x20000 + *(int *)((long)_chip + 0x404)) >> 0x10 & 0x3ff)
                          + *(int *)((long)_chip + 0x444)];
          iVar13 = 0;
          if (uVar6 < 0x1600) {
            iVar13 = tl_tab[uVar6];
          }
          *(int *)((long)_chip + 0x1780) = *(int *)((long)_chip + 0x1780) + iVar13;
        }
      }
      if (*(char *)((long)_chip + 0x1769) == '\0') {
        if ((bVar2 & 0x20) == 0) {
          if (*(char *)((long)_chip + 0x50e) == '\0') {
            uVar6 = (*(uint *)((long)_chip + 0x4a0) & uVar12) +
                    *(int *)((long)_chip + 0x488) + *(int *)((long)_chip + 0x484);
            iVar13 = *(int *)((long)_chip + 0x474);
            iVar7 = *(int *)((long)_chip + 0x478);
            *(int *)((long)_chip + 0x474) = iVar7;
            *(undefined4 *)((long)_chip + 0x478) = 0;
            if (uVar6 < 0xb0) {
              iVar13 = iVar13 + iVar7;
              iVar10 = 0;
              if (*(byte *)((long)_chip + 0x470) == 0) {
                iVar13 = 0;
              }
              uVar6 = uVar6 * 0x20 +
                      sin_tab[((*(uint *)((long)_chip + 0x468) & 0x3ff0000) +
                               (iVar13 << (*(byte *)((long)_chip + 0x470) & 0x1f)) >> 0x10 & 0x3ff)
                              + *(int *)((long)_chip + 0x4a8)];
              if (uVar6 < 0x1600) {
                iVar10 = tl_tab[uVar6];
              }
              *(int *)((long)_chip + 0x478) = iVar10;
            }
            uVar6 = (*(uint *)((long)_chip + 0x4f4) & uVar12) +
                    *(int *)((long)_chip + 0x4dc) + *(int *)((long)_chip + 0x4d8);
            if (uVar6 < 0xb0) {
              uVar6 = uVar6 * 0x20 +
                      sin_tab[((uint)(iVar7 * 0x20000 + *(int *)((long)_chip + 0x4bc)) >> 0x10 &
                              0x3ff) + *(int *)((long)_chip + 0x4fc)];
              iVar13 = 0;
              if (uVar6 < 0x1600) {
                iVar13 = tl_tab[uVar6];
              }
              *(int *)((long)_chip + 0x1780) = *(int *)((long)_chip + 0x1780) + iVar13;
            }
          }
          if (*(char *)((long)_chip + 0x5c6) == '\0') {
            uVar6 = (*(uint *)((long)_chip + 0x558) & uVar12) +
                    *(int *)((long)_chip + 0x540) + *(int *)((long)_chip + 0x53c);
            iVar13 = *(int *)((long)_chip + 0x52c);
            iVar7 = *(int *)((long)_chip + 0x530);
            *(int *)((long)_chip + 0x52c) = iVar7;
            *(undefined4 *)((long)_chip + 0x530) = 0;
            if (uVar6 < 0xb0) {
              iVar13 = iVar13 + iVar7;
              iVar10 = 0;
              if (*(byte *)((long)_chip + 0x528) == 0) {
                iVar13 = 0;
              }
              uVar6 = uVar6 * 0x20 +
                      sin_tab[((*(uint *)((long)_chip + 0x520) & 0x3ff0000) +
                               (iVar13 << (*(byte *)((long)_chip + 0x528) & 0x1f)) >> 0x10 & 0x3ff)
                              + *(int *)((long)_chip + 0x560)];
              if (uVar6 < 0x1600) {
                iVar10 = tl_tab[uVar6];
              }
              *(int *)((long)_chip + 0x530) = iVar10;
            }
            uVar6 = (*(uint *)((long)_chip + 0x5ac) & uVar12) +
                    *(int *)((long)_chip + 0x594) + *(int *)((long)_chip + 0x590);
            if (uVar6 < 0xb0) {
              uVar6 = uVar6 * 0x20 +
                      sin_tab[((uint)(iVar7 * 0x20000 + *(int *)((long)_chip + 0x574)) >> 0x10 &
                              0x3ff) + *(int *)((long)_chip + 0x5b4)];
              iVar13 = 0;
              if (uVar6 < 0x1600) {
                iVar13 = tl_tab[uVar6];
              }
              *(int *)((long)_chip + 0x1780) = *(int *)((long)_chip + 0x1780) + iVar13;
            }
          }
          if (*(char *)((long)_chip + 0x67e) == '\0') {
            uVar6 = (*(uint *)((long)_chip + 0x610) & uVar12) +
                    *(int *)((long)_chip + 0x5f8) + *(int *)((long)_chip + 0x5f4);
            iVar13 = *(int *)((long)_chip + 0x5e4);
            iVar7 = *(int *)((long)_chip + 0x5e8);
            *(int *)((long)_chip + 0x5e4) = iVar7;
            *(undefined4 *)((long)_chip + 0x5e8) = 0;
            if (uVar6 < 0xb0) {
              iVar13 = iVar13 + iVar7;
              iVar10 = 0;
              if (*(byte *)((long)_chip + 0x5e0) == 0) {
                iVar13 = 0;
              }
              uVar6 = uVar6 * 0x20 +
                      sin_tab[((*(uint *)((long)_chip + 0x5d8) & 0x3ff0000) +
                               (iVar13 << (*(byte *)((long)_chip + 0x5e0) & 0x1f)) >> 0x10 & 0x3ff)
                              + *(int *)((long)_chip + 0x618)];
              if (uVar6 < 0x1600) {
                iVar10 = tl_tab[uVar6];
              }
              *(int *)((long)_chip + 0x5e8) = iVar10;
            }
            uVar6 = (uVar12 & *(uint *)((long)_chip + 0x664)) +
                    *(int *)((long)_chip + 0x64c) + *(int *)((long)_chip + 0x648);
            if (uVar6 < 0xb0) {
              uVar6 = uVar6 * 0x20 +
                      sin_tab[((uint)(iVar7 * 0x20000 + *(int *)((long)_chip + 0x62c)) >> 0x10 &
                              0x3ff) + *(int *)((long)_chip + 0x66c)];
              iVar13 = 0;
              if (uVar6 < 0x1600) {
                iVar13 = tl_tab[uVar6];
              }
              *(int *)((long)_chip + 0x1780) = *(int *)((long)_chip + 0x1780) + iVar13;
            }
          }
        }
        else {
          uVar6 = (*(uint *)((long)_chip + 0x4a0) & uVar12) +
                  *(int *)((long)_chip + 0x488) + *(int *)((long)_chip + 0x484);
          iVar13 = *(int *)((long)_chip + 0x474);
          iVar7 = *(int *)((long)_chip + 0x478);
          *(int *)((long)_chip + 0x474) = iVar7;
          *(undefined4 *)((long)_chip + 0x478) = 0;
          if (uVar6 < 0xb0) {
            iVar13 = iVar13 + iVar7;
            iVar10 = 0;
            if (*(byte *)((long)_chip + 0x470) == 0) {
              iVar13 = 0;
            }
            uVar6 = uVar6 * 0x20 +
                    sin_tab[((*(uint *)((long)_chip + 0x468) & 0x3ff0000) +
                             (iVar13 << (*(byte *)((long)_chip + 0x470) & 0x1f)) >> 0x10 & 0x3ff) +
                            *(int *)((long)_chip + 0x4a8)];
            if (uVar6 < 0x1600) {
              iVar10 = tl_tab[uVar6];
            }
            *(int *)((long)_chip + 0x478) = iVar10;
          }
          uVar6 = (*(uint *)((long)_chip + 0x4f4) & uVar12) +
                  *(int *)((long)_chip + 0x4dc) + *(int *)((long)_chip + 0x4d8);
          if ((uVar6 < 0xb0) && (*(char *)((long)_chip + 0x689) == '\0')) {
            uVar6 = uVar6 * 0x20 +
                    sin_tab[((uint)(iVar7 * 0x20000 + *(int *)((long)_chip + 0x4bc)) >> 0x10 & 0x3ff
                            ) + *(int *)((long)_chip + 0x4fc)];
            iVar13 = 0;
            if (uVar6 < 0x1600) {
              iVar13 = tl_tab[uVar6] * 2;
            }
            *(int *)((long)_chip + 0x1784) = iVar13;
          }
          uVar17 = *(uint *)((long)_chip + 0x6bc) & 1;
          uVar6 = (*(uint *)((long)_chip + 0x558) & uVar12) +
                  *(int *)((long)_chip + 0x540) + *(int *)((long)_chip + 0x53c);
          if ((uVar6 < 0xb0) && (*(char *)((long)_chip + 0x68d) == '\0')) {
            uVar11 = *(uint *)((long)_chip + 0x520);
            uVar11 = *(uint *)((long)_chip + 0x62c) >> 0x15 | *(uint *)((long)_chip + 0x62c) >> 0x13
                     | uVar11 >> 0x13 | uVar11 >> 0x17 ^ uVar11 >> 0x12;
            iVar13 = 0x234;
            if ((uVar11 & 1) == 0) {
              iVar13 = 0xd0;
            }
            iVar7 = iVar13;
            if (uVar17 != 0) {
              iVar13 = 0x34;
              iVar7 = 0x2d0;
            }
            if ((uVar11 & 1) != 0) {
              iVar13 = iVar7;
            }
            uVar6 = uVar6 * 0x20 + sin_tab[(uint)(iVar13 + *(int *)((long)_chip + 0x560))];
            iVar13 = 0;
            if (uVar6 < 0x1600) {
              iVar13 = tl_tab[uVar6] * 2;
            }
            *(int *)((long)_chip + 0x1784) = *(int *)((long)_chip + 0x1784) + iVar13;
          }
          uVar6 = (*(uint *)((long)_chip + 0x5ac) & uVar12) +
                  *(int *)((long)_chip + 0x594) + *(int *)((long)_chip + 0x590);
          if ((uVar6 < 0xb0) && (*(char *)((long)_chip + 0x68a) == '\0')) {
            uVar6 = uVar6 * 0x20 +
                    sin_tab[(uVar17 << 8 ^ (*(byte *)((long)_chip + 0x523) & 1) * 0x100 + 0x100) +
                            *(int *)((long)_chip + 0x5b4)];
            iVar13 = 0;
            if (uVar6 < 0x1600) {
              iVar13 = tl_tab[uVar6] * 2;
            }
            *(int *)((long)_chip + 0x1784) = *(int *)((long)_chip + 0x1784) + iVar13;
          }
          uVar6 = (*(uint *)((long)_chip + 0x610) & uVar12) +
                  *(int *)((long)_chip + 0x5f8) + *(int *)((long)_chip + 0x5f4);
          if ((uVar6 < 0xb0) && (*(char *)((long)_chip + 0x68b) == '\0')) {
            uVar6 = uVar6 * 0x20 +
                    sin_tab[(*(ushort *)((long)_chip + 0x5da) & 0x3ff) +
                            *(int *)((long)_chip + 0x618)];
            iVar13 = 0;
            if (uVar6 < 0x1600) {
              iVar13 = tl_tab[uVar6] * 2;
            }
            *(int *)((long)_chip + 0x1784) = *(int *)((long)_chip + 0x1784) + iVar13;
          }
          uVar6 = (uVar12 & *(uint *)((long)_chip + 0x664)) +
                  *(int *)((long)_chip + 0x64c) + *(int *)((long)_chip + 0x648);
          if ((uVar6 < 0xb0) && (*(char *)((long)_chip + 0x68c) == '\0')) {
            uVar12 = *(uint *)((long)_chip + 0x520);
            uVar6 = uVar6 * 0x20 +
                    sin_tab[*(int *)((long)_chip + 0x66c) +
                            ((*(uint *)((long)_chip + 0x62c) >> 0x15 |
                              *(uint *)((long)_chip + 0x62c) >> 0x13 |
                             uVar12 >> 0x13 | uVar12 >> 0x17 ^ uVar12 >> 0x12) & 1) * 0x200 + 0x100]
            ;
            iVar13 = 0;
            if (uVar6 < 0x1600) {
              iVar13 = tl_tab[uVar6] * 2;
            }
            *(int *)((long)_chip + 0x1784) = *(int *)((long)_chip + 0x1784) + iVar13;
          }
        }
      }
      pDVar3[uVar16] = *(int *)((long)_chip + 0x1784) + *(int *)((long)_chip + 0x1780);
      pDVar4[uVar16] = *(int *)((long)_chip + 0x1784) + *(int *)((long)_chip + 0x1780);
      uVar6 = *(uint *)((long)_chip + 0x69c);
      uVar12 = *(int *)((long)_chip + 0x694) + *(int *)((long)_chip + 0x698);
      *(uint *)((long)_chip + 0x694) = uVar12;
      while (uVar6 <= uVar12) {
        *(uint *)((long)_chip + 0x694) = uVar12 - uVar6;
        *(int *)((long)_chip + 0x690) = *(int *)((long)_chip + 0x690) + 1;
        uVar6 = 0;
        do {
          lVar8 = (ulong)(uVar6 >> 1) * 0xb8;
          lVar5 = lVar8 + 8;
          lVar18 = (ulong)(uVar6 & 1) * 0x54;
          uVar12 = (uint)*(byte *)((long)_chip + lVar18 + 0x25 + lVar5);
          if (uVar12 - 1 < 5) {
            lVar18 = lVar18 + lVar5;
            switch(uVar12) {
            case 1:
              if (((uVar6 & 1) != 0) ||
                 ((0xb < uVar6 && ((*(byte *)((long)_chip + 0x6a0) & 0x20) != 0)))) {
                if (*(char *)((long)_chip + lVar18 + 0x24) == '\0') {
                  bVar9 = *(byte *)((long)_chip + lVar18 + 0x40);
                  uVar12 = *(uint *)((long)_chip + 0x690);
LAB_00120ebf:
                  if ((uVar12 & ~(-1 << (bVar9 & 0x1f))) != 0) break;
                  uVar12 = uVar12 >> (bVar9 & 0x1f);
                  bVar9 = *(byte *)((long)_chip + lVar18 + 0x41);
                }
                else {
                  uVar12 = *(uint *)((long)_chip + 0x690);
                  if (*(char *)((long)_chip + lVar8 + 0xbd) != '\0') {
                    bVar9 = *(byte *)((long)_chip + lVar18 + 0x40);
                    goto LAB_00120ebf;
                  }
                  bVar9 = *(byte *)((long)_chip + lVar18 + 0x3e);
                  if ((uVar12 & ~(-1 << (bVar9 & 0x1f))) != 0) break;
                  uVar12 = uVar12 >> (bVar9 & 0x1f);
                  bVar9 = *(byte *)((long)_chip + lVar18 + 0x3f);
                }
                iVar13 = (uint)""[(ulong)(uVar12 & 7) + (ulong)bVar9] +
                         *(int *)((long)_chip + lVar18 + 0x30);
                *(int *)((long)_chip + lVar18 + 0x30) = iVar13;
                if (0xfe < iVar13) {
                  *(undefined4 *)((long)_chip + lVar18 + 0x30) = 0xff;
                  *(undefined1 *)((long)_chip + lVar18 + 0x25) = 0;
                }
              }
              break;
            case 2:
              if (*(char *)((long)_chip + lVar18 + 0x24) == '\0') {
                bVar9 = *(byte *)((long)_chip + lVar18 + 0x3e);
                if ((*(uint *)((long)_chip + 0x690) & ~(-1 << (bVar9 & 0x1f))) == 0) {
                  iVar13 = (uint)""[(ulong)(*(uint *)((long)_chip + 0x690) >> (bVar9 & 0x1f) & 7) +
                                    (ulong)*(byte *)((long)_chip + lVar18 + 0x3f)] +
                           *(int *)((long)_chip + lVar18 + 0x30);
                  if (0xfe < iVar13) {
                    iVar13 = 0xff;
                  }
                  *(int *)((long)_chip + lVar18 + 0x30) = iVar13;
                }
              }
              break;
            case 3:
              bVar9 = *(byte *)((long)_chip + lVar18 + 0x3c);
              if (((*(uint *)((long)_chip + 0x690) & ~(-1 << (bVar9 & 0x1f))) == 0) &&
                 (iVar13 = (uint)""[(ulong)(*(uint *)((long)_chip + 0x690) >> (bVar9 & 0x1f) & 7) +
                                    (ulong)*(byte *)((long)_chip + lVar18 + 0x3d)] +
                           *(int *)((long)_chip + lVar18 + 0x30),
                 *(int *)((long)_chip + lVar18 + 0x30) = iVar13,
                 *(int *)((long)_chip + lVar18 + 0x34) <= iVar13)) {
                *(undefined1 *)((long)_chip + lVar18 + 0x25) = 2;
              }
              break;
            case 4:
              bVar9 = *(byte *)((long)_chip + lVar18 + 0x3a);
              if ((*(uint *)((long)_chip + 0x690) & ~(-1 << (bVar9 & 0x1f))) == 0) {
                uVar12 = *(uint *)((long)_chip + lVar18 + 0x30);
                iVar13 = (int)((uint)""[(ulong)(*(uint *)((long)_chip + 0x690) >> (bVar9 & 0x1f) & 7
                                               ) + (ulong)*(byte *)((long)_chip + lVar18 + 0x3b)] *
                              ~uVar12) >> 2;
                iVar7 = iVar13 + uVar12;
                *(int *)((long)_chip + lVar18 + 0x30) = iVar7;
                if (iVar7 == 0 || SCARRY4(iVar13,uVar12) != iVar7 < 0) {
                  *(undefined4 *)((long)_chip + lVar18 + 0x30) = 0;
                  *(undefined1 *)((long)_chip + lVar18 + 0x25) = 3;
                }
              }
              break;
            case 5:
              bVar9 = *(byte *)((long)_chip + lVar18 + 0x38);
              if (((*(uint *)((long)_chip + 0x690) & ~(-1 << (bVar9 & 0x1f))) == 0) &&
                 (iVar13 = (uint)""[(ulong)(*(uint *)((long)_chip + 0x690) >> (bVar9 & 0x1f) & 7) +
                                    (ulong)*(byte *)((long)_chip + lVar18 + 0x39)] +
                           *(int *)((long)_chip + lVar18 + 0x30),
                 *(int *)((long)_chip + lVar18 + 0x30) = iVar13, 0xfe < iVar13)) {
                *(undefined4 *)((long)_chip + lVar18 + 0x30) = 0xff;
                *(undefined1 *)((long)_chip + lVar18 + 0x25) = 4;
                *(undefined4 *)((long)_chip + lVar18 + 0x10) = 0;
              }
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != 0x12);
        uVar12 = *(uint *)((long)_chip + 0x694);
        uVar6 = *(uint *)((long)_chip + 0x69c);
      }
      uVar6 = 0;
      do {
        lVar8 = (ulong)(uVar6 >> 1) * 0xb8;
        lVar5 = lVar8 + 8;
        lVar14 = (ulong)(uVar6 & 1) * 0x54;
        lVar18 = lVar14 + lVar5;
        if (*(char *)((long)_chip + lVar14 + 0x4c + lVar5) == '\0') {
LAB_00120f98:
          iVar13 = *(int *)((long)_chip + lVar18 + 0x14);
        }
        else {
          uVar12 = *(uint *)((long)_chip + lVar8 + 0xb0);
          uVar15 = (ulong)((uVar12 >> 3 & 0x38) + *(int *)((long)_chip + 0x6a8));
          if ((0x444444444444eeffU >> (uVar15 & 0x3f) & 1) != 0) goto LAB_00120f98;
          uVar12 = (int)""[uVar15] + uVar12 * 2;
          iVar13 = (uint)*(byte *)((long)_chip + lVar18 + 0xf) *
                   (*(uint *)((long)_chip + (ulong)(uVar12 & 0x3ff) * 4 + 0x768) >>
                   (~(byte)(uVar12 >> 10) & 7));
        }
        piVar1 = (int *)((long)_chip + lVar18 + 0x10);
        *piVar1 = *piVar1 + iVar13;
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x12);
      uVar6 = *(int *)((long)_chip + 0x6c0) + *(int *)((long)_chip + 0x6c4);
      *(uint *)((long)_chip + 0x6c0) = uVar6 & 0xffff;
      if (0xffff < uVar6) {
        uVar6 = uVar6 >> 0x10;
        uVar12 = *(uint *)((long)_chip + 0x6bc);
        do {
          uVar11 = uVar12 >> 1;
          uVar17 = uVar12 & 1;
          uVar12 = uVar11 ^ 0x400181;
          if (uVar17 == 0) {
            uVar12 = uVar11;
          }
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
        *(uint *)((long)_chip + 0x6bc) = uVar12;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != length);
  }
  return;
}

Assistant:

static void ym2413_update_one(void *_chip, UINT32 length, DEV_SMPL **buffers)
{
	YM2413		*chip  = (YM2413 *)_chip;
	UINT8		rhythm = chip->rhythm&0x20;
	DEV_SMPL	*bufMO = buffers[0];
	DEV_SMPL	*bufRO = buffers[1];

	UINT32 i;

	for( i=0; i < length ; i++ )
	{
		chip->output[0] = 0;
		chip->output[1] = 0;

		advance_lfo(chip);

		/* FM part */
		chan_calc(chip, &chip->P_CH[0]);
		chan_calc(chip, &chip->P_CH[1]);
		chan_calc(chip, &chip->P_CH[2]);
		chan_calc(chip, &chip->P_CH[3]);
		chan_calc(chip, &chip->P_CH[4]);
		chan_calc(chip, &chip->P_CH[5]);

		if (! chip->VRC7_Mode)
		{
			if(!rhythm)
			{
				chan_calc(chip, &chip->P_CH[6]);
				chan_calc(chip, &chip->P_CH[7]);
				chan_calc(chip, &chip->P_CH[8]);
			}
			else        /* Rhythm part */
			{
				rhythm_calc(chip, &chip->P_CH[0], chip->noise_rng & 1 );
			}
		}

		bufMO[i] = chip->output[0] + chip->output[1];
		bufRO[i] = chip->output[0] + chip->output[1];

		advance(chip);
	}
}